

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait.c
# Opt level: O0

void nsync::nsync_mu_unlock_without_wakeup(nsync_mu *mu)

{
  int iVar1;
  uint o;
  uint32_t new_word;
  uint32_t old_word;
  nsync_mu *mu_local;
  
  iVar1 = atm_cas_rel_u32_(&mu->word,1,0);
  if (iVar1 == 0) {
    o = std::atomic_load_explicit<unsigned_int>(&mu->word,memory_order_relaxed);
    if ((o - 1 & 0xffffff01) == 0) {
      if (((o & 0x8c) == 4) || (iVar1 = atm_cas_rel_u32_(&mu->word,o,o - 1), iVar1 == 0)) {
        nsync_mu_unlock_slow_(mu,(lock_type *)nsync_writer_type_);
      }
    }
    else if ((o & 0xffffff00) == 0) {
      nsync_panic_("attempt to nsync_mu_unlock() an nsync_mu not held in write mode\n");
    }
    else {
      nsync_panic_("attempt to nsync_mu_unlock() an nsync_mu held in read mode\n");
    }
  }
  return;
}

Assistant:

void nsync_mu_unlock_without_wakeup (nsync_mu *mu) {
	RWLOCK_RELEASE (mu, 1);
	IGNORE_RACES_START ();
	/* See comment in nsync_mu_unlock(). */
	if (!ATM_CAS_REL (&mu->word, MU_WLOCK, 0)) {
		uint32_t old_word = ATM_LOAD (&mu->word);
		uint32_t new_word = old_word - MU_WLOCK;
		if ((new_word & (MU_RLOCK_FIELD | MU_WLOCK)) != 0) {
			if ((old_word & MU_RLOCK_FIELD) != 0) {
				nsync_panic_ ("attempt to nsync_mu_unlock() an nsync_mu "
					      "held in read mode\n");
			} else {
				nsync_panic_ ("attempt to nsync_mu_unlock() an nsync_mu "
					      "not held in write mode\n");
			}
		} else if ((old_word & (MU_WAITING | MU_DESIG_WAKER | MU_ALL_FALSE)) ==
			   MU_WAITING || !ATM_CAS_REL (&mu->word, old_word, new_word)) {
			nsync_mu_unlock_slow_ (mu, nsync_writer_type_);
		}
	}
	IGNORE_RACES_END ();
}